

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O1

int SUNNonlinSolSolve_FixedPoint
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector y,N_Vector w,realtype tol,int callSetup,
              void *mem)

{
  ulong uVar1;
  long *plVar2;
  uint uVar3;
  uint nvec;
  void *pvVar4;
  N_Vector z;
  N_Vector x;
  N_Vector z_00;
  undefined4 *__s;
  double *pdVar5;
  N_Vector p_Var6;
  N_Vector y_00;
  long lVar7;
  N_Vector *Y;
  realtype *c;
  N_Vector *X;
  realtype *dotprods;
  N_Vector z_01;
  int iVar8;
  uint uVar9;
  double *pdVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  double *pdVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  double dVar21;
  realtype rVar22;
  double dVar23;
  double __x;
  double dVar24;
  
  iVar8 = -1;
  if (mem != (void *)0x0 &&
      ((w != (N_Vector)0x0 && y != (N_Vector)0x0) &&
      (y0 != (N_Vector)0x0 && NLS != (SUNNonlinearSolver)0x0))) {
    pvVar4 = NLS->content;
    z = *(N_Vector *)((long)pvVar4 + 0x58);
    x = *(N_Vector *)((long)pvVar4 + 0x60);
    z_00 = *(N_Vector *)((long)pvVar4 + 0x78);
    N_VScale(1.0,y0,y);
    pvVar4 = NLS->content;
    *(undefined4 *)((long)pvVar4 + 0x80) = 0;
    iVar8 = 2;
    if (0 < *(int *)((long)pvVar4 + 0x84)) {
      do {
        N_VScale(1.0,y,z);
        iVar8 = (**NLS->content)(y,x,mem);
        if (iVar8 != 0) break;
        pvVar4 = NLS->content;
        uVar3 = *(uint *)((long)pvVar4 + 0x10);
        uVar19 = (ulong)uVar3;
        if (uVar19 == 0) {
          N_VScale(1.0,x,y);
        }
        else {
          nvec = *(uint *)((long)pvVar4 + 0x80);
          __s = *(undefined4 **)((long)pvVar4 + 0x18);
          pdVar5 = *(double **)((long)pvVar4 + 0x20);
          p_Var6 = *(N_Vector *)((long)pvVar4 + 0x70);
          y_00 = *(N_Vector *)((long)pvVar4 + 0x68);
          lVar12 = *(long *)((long)pvVar4 + 0x38);
          lVar7 = *(long *)((long)pvVar4 + 0x40);
          Y = *(N_Vector **)((long)pvVar4 + 0x48);
          c = *(realtype **)((long)pvVar4 + 0x30);
          X = *(N_Vector **)((long)pvVar4 + 0x50);
          dotprods = *(realtype **)((long)pvVar4 + 0x28);
          z_01 = *(N_Vector *)((long)pvVar4 + 0x78);
          if (0 < (int)uVar3) {
            memset(__s,0,uVar19 * 4);
          }
          uVar9 = nvec - 1;
          uVar14 = (long)(int)uVar9 % (long)(int)uVar3 & 0xffffffff;
          N_VLinearSum(1.0,x,-1.0,z,z_01);
          uVar13 = (uint)((long)(int)uVar9 % (long)(int)uVar3);
          if (0 < (int)nvec) {
            N_VLinearSum(1.0,x,-1.0,p_Var6,*(N_Vector *)(lVar7 + (long)(int)uVar13 * 8));
            N_VLinearSum(1.0,z_01,-1.0,y_00,*(N_Vector *)(lVar12 + (long)(int)uVar13 * 8));
          }
          N_VScale(1.0,x,p_Var6);
          N_VScale(1.0,z_01,y_00);
          if (nvec == 1) {
            p_Var6 = *(N_Vector *)(lVar12 + uVar14 * 8);
            rVar22 = N_VDotProd(p_Var6,p_Var6);
            dVar24 = 0.0;
            if (0.0 < rVar22) {
              p_Var6 = *(N_Vector *)(lVar12 + uVar14 * 8);
              rVar22 = N_VDotProd(p_Var6,p_Var6);
              if (rVar22 < 0.0) {
                dVar24 = sqrt(rVar22);
              }
              else {
                dVar24 = SQRT(rVar22);
              }
            }
            *pdVar5 = dVar24;
            N_VScale(1.0 / dVar24,*(N_Vector *)(lVar12 + uVar14 * 8),Y[uVar14]);
            *__s = 0;
          }
          else {
            if (nvec == 0) {
              N_VScale(1.0,x,y);
              goto LAB_00102dfb;
            }
            if ((int)nvec <= (int)uVar3) {
              N_VScale(1.0,*(N_Vector *)(lVar12 + (long)(int)uVar13 * 8),y);
              if (1 < (int)nvec) {
                uVar19 = 0;
                do {
                  __s[uVar19] = (int)uVar19;
                  rVar22 = N_VDotProd(Y[uVar19],y);
                  pdVar5[(long)(int)(uVar9 * uVar3) + uVar19] = rVar22;
                  N_VLinearSum(1.0,y,-rVar22,Y[uVar19],y);
                  uVar19 = uVar19 + 1;
                } while (uVar9 != uVar19);
              }
              rVar22 = N_VDotProd(y,y);
              dVar24 = 0.0;
              if (0.0 < rVar22) {
                rVar22 = N_VDotProd(y,y);
                if (rVar22 < 0.0) {
                  dVar24 = sqrt(rVar22);
                }
                else {
                  dVar24 = SQRT(rVar22);
                }
              }
              pdVar5[(long)(int)(uVar3 * uVar9 + nvec) + -1] = dVar24;
              N_VScale((realtype)(~-(ulong)(dVar24 == 0.0) & (ulong)(1.0 / dVar24)),y,Y[(int)uVar13]
                      );
              __s[(int)uVar9] = uVar9;
              goto LAB_00102c79;
            }
            uVar9 = uVar3 - 1;
            if ((int)uVar3 < 2) {
LAB_00102b6c:
              N_VScale(1.0,*(N_Vector *)(lVar12 + (long)(int)uVar13 * 8),y);
            }
            else {
              uVar17 = (ulong)uVar9;
              pdVar15 = pdVar5 + uVar19 * 2 + 1;
              uVar18 = 2;
              uVar14 = 0;
              do {
                uVar1 = uVar14 + 1;
                uVar11 = (ulong)(uVar3 * (int)uVar1);
                dVar24 = pdVar5[uVar14 + uVar11];
                dVar23 = pdVar5[uVar14 + uVar11 + 1];
                __x = dVar24 * dVar24 + dVar23 * dVar23;
                dVar21 = 0.0;
                if (0.0 < __x) {
                  if (__x < 0.0) {
                    dVar21 = sqrt(__x);
                  }
                  else {
                    dVar21 = SQRT(__x);
                  }
                }
                dVar24 = dVar24 / dVar21;
                dVar23 = dVar23 / dVar21;
                pdVar5[uVar14 + uVar11] = dVar21;
                pdVar5[uVar14 + uVar11 + 1] = 0.0;
                if ((int)uVar14 + 2 < (int)uVar3) {
                  pdVar10 = pdVar15;
                  uVar11 = uVar19;
                  do {
                    dVar21 = *pdVar10;
                    *pdVar10 = pdVar10[-1] * -dVar23 + dVar21 * dVar24;
                    pdVar10[-1] = dVar24 * pdVar10[-1] + dVar23 * dVar21;
                    uVar11 = uVar11 - 1;
                    pdVar10 = pdVar10 + uVar19;
                  } while (uVar18 != uVar11);
                }
                N_VLinearSum(dVar24,Y[uVar14],dVar23,Y[uVar1],y);
                N_VLinearSum(-dVar23,Y[uVar14],dVar24,Y[uVar1],Y[uVar1]);
                N_VScale(1.0,y,Y[uVar14]);
                uVar18 = uVar18 + 1;
                pdVar15 = pdVar15 + uVar19 + 1;
                uVar14 = uVar1;
              } while (uVar1 != uVar17);
              if ((int)uVar3 < 2) goto LAB_00102b6c;
              uVar18 = 1;
              pdVar15 = pdVar5;
              uVar14 = uVar17;
              pdVar10 = pdVar5;
              do {
                do {
                  *pdVar15 = pdVar15[uVar19];
                  uVar14 = uVar14 - 1;
                  pdVar15 = pdVar15 + 1;
                } while (uVar14 != 0);
                uVar18 = uVar18 + 1;
                pdVar15 = pdVar10 + uVar19;
                uVar14 = uVar17;
                pdVar10 = pdVar15;
              } while (uVar18 != uVar19);
              N_VScale(1.0,*(N_Vector *)(lVar12 + (long)(int)uVar13 * 8),y);
              if (1 < (int)uVar3) {
                uVar19 = 0;
                do {
                  rVar22 = N_VDotProd(Y[uVar19],y);
                  pdVar5[(long)(int)(uVar9 * uVar3) + uVar19] = rVar22;
                  N_VLinearSum(1.0,y,-rVar22,Y[uVar19],y);
                  uVar19 = uVar19 + 1;
                } while (uVar17 != uVar19);
              }
            }
            rVar22 = N_VDotProd(y,y);
            dVar24 = 0.0;
            if (0.0 < rVar22) {
              rVar22 = N_VDotProd(y,y);
              if (rVar22 < 0.0) {
                dVar24 = sqrt(rVar22);
              }
              else {
                dVar24 = SQRT(rVar22);
              }
            }
            pdVar5[(long)(int)(uVar3 * uVar3) + -1] = dVar24;
            N_VScale(1.0 / dVar24,y,Y[(int)uVar9]);
            iVar8 = uVar13 + 1;
            if (iVar8 < (int)uVar3) {
              uVar19 = 0;
              do {
                __s[uVar19] = iVar8 + (int)uVar19;
                uVar19 = uVar19 + 1;
              } while (~uVar13 + uVar3 != uVar19);
              uVar19 = uVar19 & 0xffffffff;
            }
            else {
              uVar19 = 0;
            }
            if (-1 < (int)uVar13) {
              lVar12 = 0;
              do {
                __s[uVar19 + lVar12] = (int)lVar12;
                lVar12 = lVar12 + 1;
              } while (iVar8 != (int)lVar12);
            }
          }
LAB_00102c79:
          if ((int)uVar3 < (int)nvec) {
            nvec = uVar3;
          }
          uVar19 = (ulong)nvec;
          iVar8 = N_VDotProdMulti(nvec,z_01,Y,dotprods);
          if (iVar8 == 0) {
            *c = 1.0;
            *X = x;
            if ((int)nvec < 1) {
              uVar14 = 1;
            }
            else {
              lVar12 = (long)(int)uVar3;
              pdVar15 = (double *)((long)pdVar5 + (lVar12 * 8 + 8) * uVar19 + -8);
              uVar14 = 1;
              lVar16 = 0;
              uVar18 = uVar19;
              do {
                uVar17 = uVar18 - 1;
                if ((long)uVar18 < (long)uVar19) {
                  rVar22 = dotprods[uVar17];
                  pdVar10 = pdVar15;
                  lVar20 = lVar16;
                  do {
                    rVar22 = rVar22 - *pdVar10 * dotprods[uVar19 + lVar20];
                    dotprods[uVar17] = rVar22;
                    lVar20 = lVar20 + 1;
                    pdVar10 = pdVar10 + lVar12;
                  } while ((int)lVar20 != 0);
                }
                dVar24 = dotprods[uVar17];
                dVar23 = 0.0;
                if ((dVar24 != 0.0) || (NAN(dVar24))) {
                  dVar23 = dVar24 / pdVar5[(int)((uVar3 + 1) * (int)uVar17)];
                }
                dotprods[uVar17] = dVar23;
                c[uVar14] = -dVar23;
                X[uVar14] = *(N_Vector *)(lVar7 + (long)(int)__s[uVar17] * 8);
                uVar14 = uVar14 + 1;
                lVar16 = lVar16 + -1;
                pdVar15 = (double *)((long)pdVar15 + (lVar12 * 8 ^ 0xfffffffffffffff8U));
                uVar18 = uVar17;
              } while (uVar14 != nvec + 1);
            }
            N_VLinearCombination((int)uVar14,c,X,y);
          }
        }
LAB_00102dfb:
        plVar2 = (long *)((long)NLS->content + 0x88);
        *plVar2 = *plVar2 + 1;
        N_VLinearSum(1.0,y,-1.0,z,z_00);
        iVar8 = (**(code **)((long)NLS->content + 8))(tol,NLS,y,z_00,w,mem);
        if (iVar8 != 1) {
          if (iVar8 == 0) {
            return 0;
          }
          goto LAB_00102f2b;
        }
        pvVar4 = NLS->content;
        iVar8 = *(int *)((long)pvVar4 + 0x80) + 1;
        *(int *)((long)pvVar4 + 0x80) = iVar8;
      } while (iVar8 < *(int *)((long)pvVar4 + 0x84));
      iVar8 = 2;
    }
LAB_00102f2b:
    plVar2 = (long *)((long)NLS->content + 0x90);
    *plVar2 = *plVar2 + 1;
  }
  return iVar8;
}

Assistant:

int SUNNonlinSolSolve_FixedPoint(SUNNonlinearSolver NLS, N_Vector y0,
                                 N_Vector y, N_Vector w, realtype tol,
                                 booleantype callSetup, void* mem)
{
  /* local variables */
  int retval;
  N_Vector yprev, gy, delta;

  /* check that the inputs are non-null */
  if ( (NLS == NULL) || (y0 == NULL) || (y == NULL) || (w == NULL) || (mem == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* set local shortcut variables */
  yprev = FP_CONTENT(NLS)->yprev;
  gy    = FP_CONTENT(NLS)->gy;
  delta = FP_CONTENT(NLS)->delta;

  /* load prediction into y */
  N_VScale(ONE, y0, y);

  /* Looping point for attempts at solution of the nonlinear system:
       Evaluate fixed-point function (store in gy).
       Performs the accelerated fixed-point iteration.
       Performs stopping tests. */
  for( FP_CONTENT(NLS)->curiter = 0;
       FP_CONTENT(NLS)->curiter < FP_CONTENT(NLS)->maxiters;
       FP_CONTENT(NLS)->curiter++ ) {

    /* update previous solution guess */
    N_VScale(ONE, y, yprev);

    /* compute fixed-point iteration function, store in gy */
    retval = FP_CONTENT(NLS)->Sys(y, gy, mem);
    if (retval != SUN_NLS_SUCCESS) break;

    /* perform fixed point update, based on choice of acceleration or not */
    if (FP_CONTENT(NLS)->m == 0) {    /* basic fixed-point solver */
      N_VScale(ONE, gy, y);
    } else {                          /* Anderson-accelerated solver */
      retval = AndersonAccelerate(NLS, gy, y, yprev, FP_CONTENT(NLS)->curiter);
    }

    /* increment nonlinear solver iteration counter */
    FP_CONTENT(NLS)->niters++;

    /* compute change in solution, and call the convergence test function */
    N_VLinearSum(ONE, y, -ONE, yprev, delta);

    /* test for convergence */
    retval = FP_CONTENT(NLS)->CTest(NLS, y, delta, tol, w, mem);

    /* return if successful */
    if (retval == SUN_NLS_SUCCESS)  return(SUN_NLS_SUCCESS);

    /* check if the iterations should continue; otherwise increment the
       convergence failure count and return error flag */
    if (retval != SUN_NLS_CONTINUE) {
      FP_CONTENT(NLS)->nconvfails++;
      return(retval);
    }

  }

  /* if we've reached this point, then we exhausted the iteration limit;
     increment the convergence failure count and return */
  FP_CONTENT(NLS)->nconvfails++;
  return(SUN_NLS_CONV_RECVR);
}